

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxalloc.h
# Opt level: O2

void soplex::
     spx_alloc<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DoubletonEquationPS*>
               (DoubletonEquationPS **p,int n)

{
  DoubletonEquationPS *pDVar1;
  ostream *poVar2;
  SPxMemoryException *this;
  allocator local_39;
  string local_38;
  
  pDVar1 = (DoubletonEquationPS *)malloc((ulong)(n + (uint)(n == 0)) * 0x2c8);
  *p = pDVar1;
  if (pDVar1 != (DoubletonEquationPS *)0x0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"EMALLC01 malloc: Out of memory - cannot allocate "
                          );
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bytes");
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (SPxMemoryException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"XMALLC01 malloc: Could not allocate enough memory",&local_39);
  SPxMemoryException::SPxMemoryException(this,&local_38);
  __cxa_throw(this,&SPxMemoryException::typeinfo,SPxException::~SPxException);
}

Assistant:

inline void spx_alloc(T& p, int n = 1)
{
   assert(p == nullptr);
   assert(n >= 0);

   if(n == 0)
      n = 1;

   try
   {
      p = reinterpret_cast<T>(malloc(sizeof(*p) * (unsigned int) n));
   }
   catch(const std::bad_alloc&)
   {
      throw(SPxMemoryException("Error allocating memory"));
   }

   if(nullptr == p)
   {
      // coverity[suspicious_sizeof]
      std::cerr << "EMALLC01 malloc: Out of memory - cannot allocate "
                << sizeof(*p) * (unsigned int) n << " bytes" << std::endl;
      throw(SPxMemoryException("XMALLC01 malloc: Could not allocate enough memory"));
   }
}